

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testFutureProofing.cpp
# Opt level: O2

void anon_unknown.dwarf_1b0988::fillPixels<unsigned_int>
               (Array2D<unsigned_int> *sampleCount,Array2D<unsigned_int_*> *ph,int width,int height)

{
  uint **ppuVar1;
  uint *puVar2;
  ulong uVar3;
  ulong uVar4;
  int x;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  ulong uVar8;
  long lVar9;
  
  Imf_3_2::Array2D<unsigned_int_*>::resizeErase(ph,(long)height,(long)width);
  uVar3 = 0;
  uVar4 = 0;
  if (0 < width) {
    uVar4 = (ulong)(uint)width;
  }
  uVar8 = (ulong)(uint)height;
  if (height < 1) {
    uVar8 = uVar3;
  }
  for (; uVar3 != uVar8; uVar3 = uVar3 + 1) {
    lVar9 = sampleCount->_sizeY * uVar3;
    lVar7 = ph->_sizeY * uVar3;
    for (uVar5 = 0; uVar5 != uVar4; uVar5 = uVar5 + 1) {
      puVar2 = (uint *)operator_new__((ulong)sampleCount->_data[lVar9 + uVar5] << 2);
      ph->_data[lVar7 + uVar5] = puVar2;
      puVar2 = sampleCount->_data;
      ppuVar1 = ph->_data;
      for (uVar6 = 0; uVar6 < puVar2[lVar9 + uVar5]; uVar6 = uVar6 + 1) {
        ppuVar1[lVar7 + uVar5][uVar6] = ((int)uVar3 * width + (int)uVar5) % 0x801;
      }
    }
  }
  return;
}

Assistant:

void
fillPixels (
    Array2D<unsigned int>& sampleCount, Array2D<T*>& ph, int width, int height)
{
    ph.resizeErase (height, width);
    for (int y = 0; y < height; ++y)
        for (int x = 0; x < width; ++x)
        {
            ph[y][x] = new T[sampleCount[y][x]];
            for (unsigned int i = 0; i < sampleCount[y][x]; i++)
            {
                //
                // We do this because half cannot store number bigger than 2048 exactly.
                //
                ph[y][x][i] = (y * width + x) % 2049;
            }
        }
}